

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::setButtonLayout(QWizardPrivate *this,WizardButton *array,int size)

{
  WizardButton which;
  int iVar1;
  long *plVar2;
  QWidget *this_00;
  ulong uVar3;
  ulong uVar4;
  QWidget *first;
  long lVar5;
  
  first = &this->pageFrame->super_QWidget;
  iVar1 = (**(code **)(*(long *)&(this->buttonLayout->super_QBoxLayout).super_QLayout + 200))();
  while (0 < iVar1) {
    iVar1 = iVar1 + -1;
    plVar2 = (long *)(**(code **)(*(long *)&(this->buttonLayout->super_QBoxLayout).super_QLayout +
                                 0xb0))(this->buttonLayout,iVar1);
    this_00 = (QWidget *)(**(code **)(*plVar2 + 0x68))(plVar2);
    if (this_00 != (QWidget *)0x0) {
      QWidget::hide(this_00);
    }
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)size;
  if (size < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    which = array[uVar4];
    lVar5 = (long)which;
    if (lVar5 != -1) {
      if (which == NButtons) {
        QBoxLayout::addStretch(&this->buttonLayout->super_QBoxLayout,1);
      }
      else {
        ensureButton(this,which);
        QBoxLayout::addWidget
                  (&this->buttonLayout->super_QBoxLayout,
                   *(QWidget **)((long)&this->field_20 + lVar5 * 8),0,(Alignment)0x0);
        if (3 < (uint)which) {
          QWidget::show(*(QWidget **)((long)&this->field_20 + lVar5 * 8));
        }
        if (first != (QWidget *)0x0) {
          QWidget::setTabOrder(first,*(QWidget **)((long)&this->field_20 + lVar5 * 8));
        }
        first = *(QWidget **)((long)&this->field_20 + lVar5 * 8);
      }
    }
  }
  _q_updateButtonStates(this);
  return;
}

Assistant:

void QWizardPrivate::setButtonLayout(const QWizard::WizardButton *array, int size)
{
    QWidget *prev = pageFrame;

    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    for (int i = 0; i < size; ++i) {
        QWizard::WizardButton which = array[i];
        if (which == QWizard::Stretch) {
            buttonLayout->addStretch(1);
        } else if (which != QWizard::NoButton) {
            ensureButton(which);
            buttonLayout->addWidget(btns[which]);

            // Back, Next, Commit, and Finish are handled in _q_updateButtonStates()
            if (which != QWizard::BackButton && which != QWizard::NextButton
                && which != QWizard::CommitButton && which != QWizard::FinishButton)
                btns[which]->show();

            if (prev)
                QWidget::setTabOrder(prev, btns[which]);
            prev = btns[which];
        }
    }

    _q_updateButtonStates();
}